

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj.c
# Opt level: O0

char * strof_entry_type(EntryType type)

{
  char *local_20;
  char *pcStack_10;
  EntryType type_local;
  
  if ((type & 0xfffffff0) == ENTRY_TYPE_NONE) {
    if (strof_entry_type::ELEM_TYPE_names[type] == (char *)0x0) {
      local_20 = strof_entry_type::invalid_type_str;
    }
    else {
      local_20 = strof_entry_type::ELEM_TYPE_names[type];
    }
    pcStack_10 = local_20;
  }
  else {
    pcStack_10 = strof_entry_type::invalid_type_str;
  }
  return pcStack_10;
}

Assistant:

const char *strof_entry_type(EntryType type)
{
    static const char *ELEM_TYPE_names[] = {
        [ELEM_TYPE_s32]    = "s32",
        [ELEM_TYPE_u32]    = "u32",
        [ELEM_TYPE_s64]    = "s64",
        [ELEM_TYPE_u64]    = "u64",
        [ELEM_TYPE_st]     = "struct",
        [ELEM_TYPE_shm]    = "shm_ptr",
        [ELEM_TYPE_kobj]   = "kobj",
        [ELEM_TYPE_kptr]   = "kptr",
        [ELEM_TYPE_kfp]    = "kfunc_ptr",
        [ELEM_TYPE_uobj]   = "uobj",
        [ELEM_TYPE_uptr]   = "uptr",
        [ELEM_TYPE_ufp]    = "ufunc_ptr",
    };
    static const char *invalid_type_str = "invalid";

    if (type & (~ELEM_TYPE_BUTT))
        return invalid_type_str;

    return ELEM_TYPE_names[type] ? ELEM_TYPE_names[type] : invalid_type_str;
}